

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

void ga_sscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Real *alpha)

{
  Integer atype;
  long local_38;
  
  pnga_inquire_type(*g_a,&local_38);
  if (local_38 != 0x3eb) {
    pnga_error(" wrong types ",0);
  }
  sga_scale_patch(*g_a,ilo,ihi,jlo,jhi,alpha);
  return;
}

Assistant:

void FATR ga_sscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, Real *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_FLOAT) pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}